

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tensor.h
# Opt level: O0

unique_ptr<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>_> __thiscall
YacclabTensorOutput2D::Copy(YacclabTensorOutput2D *this)

{
  undefined1 local_20 [16];
  YacclabTensorOutput2D *this_local;
  
  this_local = this;
  std::make_unique<YacclabTensorOutput2D,cv::Mat_<int>const&>((Mat_<int> *)local_20);
  std::unique_ptr<YacclabTensorOutput,std::default_delete<YacclabTensorOutput>>::
  unique_ptr<YacclabTensorOutput2D,std::default_delete<YacclabTensorOutput2D>,void>
            ((unique_ptr<YacclabTensorOutput,std::default_delete<YacclabTensorOutput>> *)this,
             (unique_ptr<YacclabTensorOutput2D,_std::default_delete<YacclabTensorOutput2D>_> *)
             local_20);
  std::unique_ptr<YacclabTensorOutput2D,_std::default_delete<YacclabTensorOutput2D>_>::~unique_ptr
            ((unique_ptr<YacclabTensorOutput2D,_std::default_delete<YacclabTensorOutput2D>_> *)
             local_20);
  return (__uniq_ptr_data<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>,_true,_true>
         )(__uniq_ptr_data<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>,_true,_true>
           )this;
}

Assistant:

virtual std::unique_ptr<YacclabTensorOutput> Copy() const override {  return std::make_unique<YacclabTensorOutput2D>(mat_);  }